

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode create_conn_helper_init_proxy(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  curl_proxytype proxytype;
  bool local_59;
  char *local_58;
  char *pcStack_40;
  curl_proxytype ptype;
  char *p;
  char *pcStack_30;
  CURLcode result;
  char *no_proxy;
  char *socksproxy;
  char *proxy;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  socksproxy = (char *)0x0;
  no_proxy = (char *)0x0;
  pcStack_30 = (char *)0x0;
  p._4_4_ = CURLE_OK;
  if (((*(uint *)&(conn->bits).field_0x4 >> 2 & 1) == 0) ||
     (p._4_4_ = parse_proxy_auth(data,conn), p._4_4_ == CURLE_OK)) {
    if (((data->set).str[0x15] == (char *)0x0) ||
       (socksproxy = (*Curl_cstrdup)((data->set).str[0x15]), socksproxy != (char *)0x0)) {
      if (((data->set).str[0x16] == (char *)0x0) ||
         (no_proxy = (*Curl_cstrdup)((data->set).str[0x16]), no_proxy != (char *)0x0)) {
        if ((data->set).str[0x2f] == (char *)0x0) {
          pcStack_40 = "no_proxy";
          pcStack_30 = curl_getenv("no_proxy");
          if (pcStack_30 == (char *)0x0) {
            pcStack_40 = "NO_PROXY";
            pcStack_30 = curl_getenv("NO_PROXY");
          }
          if (pcStack_30 != (char *)0x0) {
            Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcStack_40,pcStack_30);
          }
        }
        if ((data->set).str[0x2f] == (char *)0x0) {
          local_58 = pcStack_30;
        }
        else {
          local_58 = (data->set).str[0x2f];
        }
        _Var1 = Curl_check_noproxy((conn->host).name,local_58);
        if (_Var1) {
          (*Curl_cfree)(socksproxy);
          socksproxy = (char *)0x0;
          (*Curl_cfree)(no_proxy);
          no_proxy = (char *)0x0;
        }
        else if ((socksproxy == (char *)0x0) && (no_proxy == (char *)0x0)) {
          socksproxy = detect_proxy(data,conn);
        }
        (*Curl_cfree)(pcStack_30);
        if ((socksproxy != (char *)0x0) &&
           ((*socksproxy == '\0' || ((conn->handler->flags & 0x10) != 0)))) {
          (*Curl_cfree)(socksproxy);
          socksproxy = (char *)0x0;
        }
        if ((no_proxy != (char *)0x0) &&
           ((*no_proxy == '\0' || ((conn->handler->flags & 0x10) != 0)))) {
          (*Curl_cfree)(no_proxy);
          no_proxy = (char *)0x0;
        }
        if ((socksproxy == (char *)0x0) && (no_proxy == (char *)0x0)) {
          *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffd;
          *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffe;
        }
        else {
          proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
          if (socksproxy != (char *)0x0) {
            p._4_4_ = parse_proxy(data,conn,socksproxy,proxytype);
            (*Curl_cfree)(socksproxy);
            socksproxy = (char *)0x0;
            if (p._4_4_ != CURLE_OK) goto LAB_00136648;
          }
          if (no_proxy != (char *)0x0) {
            p._4_4_ = parse_proxy(data,conn,no_proxy,proxytype);
            (*Curl_cfree)(no_proxy);
            no_proxy = (char *)0x0;
            if (p._4_4_ != CURLE_OK) goto LAB_00136648;
          }
          if ((conn->http_proxy).host.rawalloc == (char *)0x0) {
            *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffe;
            *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffff7;
          }
          else {
            if ((conn->handler->protocol & 3) == 0) {
              if (((conn->handler->flags & 0x800) == 0) ||
                 ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) != 0)) {
                *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffff7 | 8
                ;
              }
              else {
                conn->handler = &Curl_handler_http;
              }
            }
            *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffe | 1;
          }
          if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
            *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffd;
          }
          else {
            if (((conn->http_proxy).host.rawalloc == (char *)0x0) &&
               ((conn->socks_proxy).user == (char *)0x0)) {
              (conn->socks_proxy).user = (conn->http_proxy).user;
              (conn->http_proxy).user = (char *)0x0;
              (*Curl_cfree)((conn->socks_proxy).passwd);
              (conn->socks_proxy).passwd = (char *)0x0;
              (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
              (conn->http_proxy).passwd = (char *)0x0;
            }
            *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffd | 2;
          }
        }
        local_59 = true;
        if ((*(uint *)&(conn->bits).field_0x4 & 1) == 0) {
          local_59 = (*(uint *)&(conn->bits).field_0x4 >> 1 & 1) != 0;
        }
        *(uint *)&(conn->bits).field_0x4 =
             *(uint *)&(conn->bits).field_0x4 & 0xffffffdf | (uint)local_59 << 5;
        if ((*(uint *)&(conn->bits).field_0x4 >> 5 & 1) == 0) {
          *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xffffffdf;
          *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffe;
          *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffd;
          *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffb;
          *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffffff7;
          (conn->http_proxy).proxytype = '\0';
        }
      }
      else {
        Curl_failf(data,"memory shortage");
        p._4_4_ = CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      Curl_failf(data,"memory shortage");
      p._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
LAB_00136648:
  (*Curl_cfree)(no_proxy);
  (*Curl_cfree)(socksproxy);
  return p._4_4_;
}

Assistant:

static CURLcode create_conn_helper_init_proxy(struct Curl_easy *data,
                                              struct connectdata *conn)
{
  char *proxy = NULL;
  char *socksproxy = NULL;
  char *no_proxy = NULL;
  CURLcode result = CURLE_OK;

  /*************************************************************
   * Extract the user and password from the authentication string
   *************************************************************/
  if(conn->bits.proxy_user_passwd) {
    result = parse_proxy_auth(data, conn);
    if(result)
      goto out;
  }

  /*************************************************************
   * Detect what (if any) proxy to use
   *************************************************************/
  if(data->set.str[STRING_PROXY]) {
    proxy = strdup(data->set.str[STRING_PROXY]);
    /* if global proxy is set, this is it */
    if(!proxy) {
      failf(data, "memory shortage");
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(data->set.str[STRING_PRE_PROXY]) {
    socksproxy = strdup(data->set.str[STRING_PRE_PROXY]);
    /* if global socks proxy is set, this is it */
    if(!socksproxy) {
      failf(data, "memory shortage");
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(!data->set.str[STRING_NOPROXY]) {
    const char *p = "no_proxy";
    no_proxy = curl_getenv(p);
    if(!no_proxy) {
      p = "NO_PROXY";
      no_proxy = curl_getenv(p);
    }
    if(no_proxy) {
      infof(data, "Uses proxy env variable %s == '%s'", p, no_proxy);
    }
  }

  if(Curl_check_noproxy(conn->host.name, data->set.str[STRING_NOPROXY] ?
                        data->set.str[STRING_NOPROXY] : no_proxy)) {
    Curl_safefree(proxy);
    Curl_safefree(socksproxy);
  }
#ifndef CURL_DISABLE_HTTP
  else if(!proxy && !socksproxy)
    /* if the host is not in the noproxy list, detect proxy. */
    proxy = detect_proxy(data, conn);
#endif /* CURL_DISABLE_HTTP */

  Curl_safefree(no_proxy);

#ifdef USE_UNIX_SOCKETS
  /* For the time being do not mix proxy and unix domain sockets. See #1274 */
  if(proxy && conn->unix_domain_socket) {
    free(proxy);
    proxy = NULL;
  }
#endif

  if(proxy && (!*proxy || (conn->handler->flags & PROTOPT_NONETWORK))) {
    free(proxy);  /* Don't bother with an empty proxy string or if the
                     protocol doesn't work with network */
    proxy = NULL;
  }
  if(socksproxy && (!*socksproxy ||
                    (conn->handler->flags & PROTOPT_NONETWORK))) {
    free(socksproxy);  /* Don't bother with an empty socks proxy string or if
                          the protocol doesn't work with network */
    socksproxy = NULL;
  }

  /***********************************************************************
   * If this is supposed to use a proxy, we need to figure out the proxy host
   * name, proxy type and port number, so that we can re-use an existing
   * connection that may exist registered to the same proxy host.
   ***********************************************************************/
  if(proxy || socksproxy) {
    curl_proxytype ptype = (curl_proxytype)conn->http_proxy.proxytype;
    if(proxy) {
      result = parse_proxy(data, conn, proxy, ptype);
      Curl_safefree(proxy); /* parse_proxy copies the proxy string */
      if(result)
        goto out;
    }

    if(socksproxy) {
      result = parse_proxy(data, conn, socksproxy, ptype);
      /* parse_proxy copies the socks proxy string */
      Curl_safefree(socksproxy);
      if(result)
        goto out;
    }

    if(conn->http_proxy.host.rawalloc) {
#ifdef CURL_DISABLE_HTTP
      /* asking for a HTTP proxy is a bit funny when HTTP is disabled... */
      result = CURLE_UNSUPPORTED_PROTOCOL;
      goto out;
#else
      /* force this connection's protocol to become HTTP if compatible */
      if(!(conn->handler->protocol & PROTO_FAMILY_HTTP)) {
        if((conn->handler->flags & PROTOPT_PROXY_AS_HTTP) &&
           !conn->bits.tunnel_proxy)
          conn->handler = &Curl_handler_http;
        else
          /* if not converting to HTTP over the proxy, enforce tunneling */
          conn->bits.tunnel_proxy = TRUE;
      }
      conn->bits.httpproxy = TRUE;
#endif
    }
    else {
      conn->bits.httpproxy = FALSE; /* not a HTTP proxy */
      conn->bits.tunnel_proxy = FALSE; /* no tunneling if not HTTP */
    }

    if(conn->socks_proxy.host.rawalloc) {
      if(!conn->http_proxy.host.rawalloc) {
        /* once a socks proxy */
        if(!conn->socks_proxy.user) {
          conn->socks_proxy.user = conn->http_proxy.user;
          conn->http_proxy.user = NULL;
          Curl_safefree(conn->socks_proxy.passwd);
          conn->socks_proxy.passwd = conn->http_proxy.passwd;
          conn->http_proxy.passwd = NULL;
        }
      }
      conn->bits.socksproxy = TRUE;
    }
    else
      conn->bits.socksproxy = FALSE; /* not a socks proxy */
  }
  else {
    conn->bits.socksproxy = FALSE;
    conn->bits.httpproxy = FALSE;
  }
  conn->bits.proxy = conn->bits.httpproxy || conn->bits.socksproxy;

  if(!conn->bits.proxy) {
    /* we aren't using the proxy after all... */
    conn->bits.proxy = FALSE;
    conn->bits.httpproxy = FALSE;
    conn->bits.socksproxy = FALSE;
    conn->bits.proxy_user_passwd = FALSE;
    conn->bits.tunnel_proxy = FALSE;
    /* CURLPROXY_HTTPS does not have its own flag in conn->bits, yet we need
       to signal that CURLPROXY_HTTPS is not used for this connection */
    conn->http_proxy.proxytype = CURLPROXY_HTTP;
  }

out:

  free(socksproxy);
  free(proxy);
  return result;
}